

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

TRef snap_pref(jit_State *J,GCtrace *T,SnapEntry *map,MSize nmax,BloomFilter seen,IRRef ref)

{
  uint uVar1;
  TRef TVar2;
  ulong uVar3;
  IRIns *pIVar4;
  
  pIVar4 = T->ir + ref;
  if (ref < 0x8000) {
    uVar1 = 0x7fff;
    switch((pIVar4->field_1).o) {
    case '\x16':
      uVar1 = (pIVar4->field_1).t.irt & 0x1f;
      uVar1 = (uVar1 << 0x18 | uVar1) ^ 0x7fff;
      break;
    case '\x17':
      TVar2 = lj_ir_kint(J,pIVar4->i);
      return TVar2;
    case '\x18':
      TVar2 = lj_ir_kgc(J,(GCobj *)(ulong)(pIVar4->field_1).op12,(uint)(pIVar4->field_1).t.irt);
      return TVar2;
    case '\x19':
      TVar2 = lj_ir_kptr_(J,IR_KPTR,(void *)(ulong)(pIVar4->field_1).op12);
      return TVar2;
    case '\x1b':
      TVar2 = lj_ir_knull(J,(pIVar4->field_1).t.irt & IRT_TYPE);
      return TVar2;
    case '\x1c':
    case '\x1d':
      TVar2 = lj_ir_k64(J,(uint)(pIVar4->field_1).o,(uint64_t)pIVar4[1]);
      return TVar2;
    }
    return uVar1;
  }
  if (((pIVar4->field_0).prev & 0xff80) == 0x80) {
    return 0;
  }
  if ((seen >> ((ulong)ref & 0x3f) & 1) != 0) {
    if (nmax != 0) {
      uVar3 = 0;
      do {
        if ((map[uVar3] & 0xffff) == ref) {
          uVar1 = J->slot[map[uVar3] >> 0x18] & 0xfffcffff;
          goto LAB_0015395a;
        }
        uVar3 = uVar3 + 1;
      } while (nmax != uVar3);
    }
    uVar1 = 0;
LAB_0015395a:
    if (uVar1 != 0) {
      return uVar1;
    }
  }
  (J->fold).ins.field_0.ot = (pIVar4->field_1).t.irt & 0x1f | 0xe00;
  (J->fold).ins.field_0.op1 = (ushort)ref ^ 0x8000;
  (J->fold).ins.field_0.op2 = 0;
  TVar2 = lj_opt_fold(J);
  return TVar2;
}

Assistant:

static TRef snap_pref(jit_State *J, GCtrace *T, SnapEntry *map, MSize nmax,
		      BloomFilter seen, IRRef ref)
{
  IRIns *ir = &T->ir[ref];
  TRef tr;
  if (irref_isk(ref))
    tr = snap_replay_const(J, ir);
  else if (!regsp_used(ir->prev))
    tr = 0;
  else if (!bloomtest(seen, ref) || (tr = snap_dedup(J, map, nmax, ref)) == 0)
    tr = emitir(IRT(IR_PVAL, irt_type(ir->t)), ref - REF_BIAS, 0);
  return tr;
}